

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O0

void __thiscall cnn::ComputationGraph::~ComputationGraph(ComputationGraph *this)

{
  long in_RDI;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *unaff_retaddr;
  
  clear(this);
  if (*(long **)(in_RDI + 0x30) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x30) + 8))();
  }
  n_hgs = n_hgs + -1;
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::~vector
            ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)unaff_retaddr);
  std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

ComputationGraph::~ComputationGraph() {
  this->clear();
  delete ee;
  --n_hgs;
}